

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  sqlite3_uint64 n;
  undefined8 *puVar1;
  char *pcVar2;
  void *__s;
  int iVar3;
  int iVar4;
  undefined8 *pOld;
  uint uVar5;
  long lVar6;
  int rc;
  size_t local_38;
  
  rc = 0;
  if (*(int *)((long)pContext + 8) != 0) {
    return *(int *)((long)pContext + 8);
  }
  pOld = *pContext;
  iVar3 = 0x8000;
  if (nToken < 0x8000) {
    iVar3 = nToken;
  }
  if (pOld == (undefined8 *)0x0) {
    uVar5 = 0;
LAB_001a7610:
    puVar1 = (undefined8 *)sqlite3_realloc64(pOld,(long)(int)uVar5 * 0x20 + 0x140);
    if (puVar1 != (undefined8 *)0x0) {
      if (pOld == (undefined8 *)0x0) {
        puVar1[6] = 0;
        puVar1[7] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      *(undefined8 **)pContext = puVar1;
      *(uint *)(puVar1 + 3) = uVar5;
      pOld = puVar1;
LAB_001a7659:
      *(uint *)(pOld + 3) = uVar5 + 1;
      lVar6 = (long)(int)uVar5;
      pOld[lVar6 * 4 + 6] = 0;
      (pOld + lVar6 * 4 + 6)[1] = 0;
      pOld[lVar6 * 4 + 4] = 0;
      (pOld + lVar6 * 4 + 4)[1] = 0;
      pcVar2 = sqlite3Fts5Strndup(&rc,pToken,iVar3);
      pOld[lVar6 * 4 + 5] = pcVar2;
      iVar4 = rc;
      goto LAB_001a76f4;
    }
  }
  else {
    uVar5 = *(uint *)(pOld + 3);
    if ((tflags & 1U) == 0 || (int)uVar5 < 1) {
      if ((uVar5 & 7) == 0) goto LAB_001a7610;
      goto LAB_001a7659;
    }
    n = (long)iVar3 + 0x31;
    __s = sqlite3_malloc64(n);
    if (__s != (void *)0x0) {
      iVar4 = 0;
      local_38 = (long)iVar3;
      memset(__s,0,n);
      *(void **)((long)__s + 8) = (void *)((long)__s + 0x30);
      memcpy((void *)((long)__s + 0x30),pToken,local_38);
      iVar3 = *(int *)(pOld + 3);
      *(undefined8 *)((long)__s + 0x18) = pOld[(long)iVar3 * 4 + 3];
      pOld[(long)iVar3 * 4 + 3] = __s;
      goto LAB_001a76f4;
    }
  }
  iVar4 = 7;
LAB_001a76f4:
  *(int *)((long)pContext + 8) = iVar4;
  return iVar4;
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->zTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      memcpy(pSyn->zTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase, 
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->zTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
    }
  }

  pCtx->rc = rc;
  return rc;
}